

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrgif.c
# Opt level: O0

djpeg_dest_ptr jinit_write_gif(j_decompress_ptr cinfo,boolean is_lzw)

{
  djpeg_dest_ptr pdVar1;
  JSAMPARRAY ppJVar2;
  undefined8 uVar3;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *p_Var4;
  int in_ESI;
  _func_void_j_decompress_ptr_djpeg_dest_ptr *in_RDI;
  gif_dest_ptr dest;
  
  pdVar1 = (djpeg_dest_ptr)(*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x180);
  pdVar1[1].start_output = in_RDI;
  pdVar1->start_output = start_output_gif;
  pdVar1->finish_output = finish_output_gif;
  pdVar1->calc_buffer_dimensions = calc_buffer_dimensions_gif;
  if ((*(int *)(in_RDI + 0x40) != 1) && (*(int *)(in_RDI + 0x40) != 2)) {
    *(undefined4 *)(*(long *)in_RDI + 0x28) = 0x3f8;
    (*(code *)**(undefined8 **)in_RDI)(in_RDI);
  }
  if (((*(int *)(in_RDI + 0x40) != 1) || (8 < *(int *)(in_RDI + 0x128))) &&
     (*(undefined4 *)(in_RDI + 0x6c) = 1, 0x100 < *(int *)(in_RDI + 0x78))) {
    *(undefined4 *)(in_RDI + 0x78) = 0x100;
  }
  jpeg_calc_output_dimensions(in_RDI);
  if (*(int *)(in_RDI + 0x94) != 1) {
    *(undefined4 *)(*(long *)in_RDI + 0x28) = 0x3f6;
    (*(code *)**(undefined8 **)in_RDI)(in_RDI);
  }
  ppJVar2 = (JSAMPARRAY)
            (**(code **)(*(long *)(in_RDI + 8) + 0x10))(in_RDI,1,*(undefined4 *)(in_RDI + 0x88));
  pdVar1->buffer = ppJVar2;
  pdVar1->buffer_height = 1;
  if (in_ESI == 0) {
    pdVar1->put_pixel_rows = put_raw_pixel_rows;
    *(undefined8 *)&pdVar1[1].buffer_height = 0;
    pdVar1[2].start_output = (_func_void_j_decompress_ptr_djpeg_dest_ptr *)0x0;
  }
  else {
    pdVar1->put_pixel_rows = put_LZW_pixel_rows;
    uVar3 = (*(code *)**(undefined8 **)(in_RDI + 8))(in_RDI,1,0x2716);
    *(undefined8 *)&pdVar1[1].buffer_height = uVar3;
    p_Var4 = (_func_void_j_decompress_ptr_djpeg_dest_ptr *)
             (**(code **)(*(long *)(in_RDI + 8) + 8))(in_RDI,1,0x4e2c);
    pdVar1[2].start_output = p_Var4;
  }
  return pdVar1;
}

Assistant:

GLOBAL(djpeg_dest_ptr)
jinit_write_gif(j_decompress_ptr cinfo, boolean is_lzw)
{
  gif_dest_ptr dest;

  /* Create module interface object, fill in method pointers */
  dest = (gif_dest_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                sizeof(gif_dest_struct));
  dest->cinfo = cinfo;          /* make back link for subroutines */
  dest->pub.start_output = start_output_gif;
  dest->pub.finish_output = finish_output_gif;
  dest->pub.calc_buffer_dimensions = calc_buffer_dimensions_gif;

  if (cinfo->out_color_space != JCS_GRAYSCALE &&
      cinfo->out_color_space != JCS_RGB)
    ERREXIT(cinfo, JERR_GIF_COLORSPACE);

  /* Force quantization if color or if > 8 bits input */
  if (cinfo->out_color_space != JCS_GRAYSCALE || cinfo->data_precision > 8) {
    /* Force quantization to at most 256 colors */
    cinfo->quantize_colors = TRUE;
    if (cinfo->desired_number_of_colors > 256)
      cinfo->desired_number_of_colors = 256;
  }

  /* Calculate output image dimensions so we can allocate space */
  jpeg_calc_output_dimensions(cinfo);

  if (cinfo->output_components != 1) /* safety check: just one component? */
    ERREXIT(cinfo, JERR_GIF_BUG);

  /* Create decompressor output buffer. */
  dest->pub.buffer = (*cinfo->mem->alloc_sarray)
    ((j_common_ptr)cinfo, JPOOL_IMAGE, cinfo->output_width, (JDIMENSION)1);
  dest->pub.buffer_height = 1;

  if (is_lzw) {
    dest->pub.put_pixel_rows = put_LZW_pixel_rows;
    /* Allocate space for hash table */
    dest->hash_code = (code_int *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  HSIZE * sizeof(code_int));
    dest->hash_value = (hash_entry *)
      (*cinfo->mem->alloc_large) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  HSIZE * sizeof(hash_entry));
  } else {
    dest->pub.put_pixel_rows = put_raw_pixel_rows;
    /* Mark tables unused */
    dest->hash_code = NULL;
    dest->hash_value = NULL;
  }

  return (djpeg_dest_ptr)dest;
}